

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>::~Vector
          (Vector<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *this)

{
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *pOVar1;
  RemoveConst<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *pRVar2;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = (this->builder).ptr;
  if (pOVar1 != (Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)0x0) {
    pRVar2 = (this->builder).pos;
    pOVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)0x0;
    (this->builder).pos =
         (RemoveConst<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *)0x0;
    (this->builder).endPtr = (Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pOVar1,0x10,(long)pRVar2 - (long)pOVar1 >> 4,(long)pOVar3 - (long)pOVar1 >> 4,
               ArrayDisposer::
               Dispose_<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,_false>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }